

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_mpsc_llfifo_unittest.cpp
# Opt level: O3

void __thiscall
cesl_mpsc_llfifo_unittest_push_beyond_full_Test::TestBody
          (cesl_mpsc_llfifo_unittest_push_beyond_full_Test *this)

{
  int iVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  int ok;
  AssertHelper local_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  undefined1 local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  int local_1c;
  
  cesl_mpsc_llfifo_create(&my_fifo_g,0x400,4,my_fifo_buffer_g[0]);
  cesl_mpsc_llfifo_push(&my_fifo_g,"first",5);
  cesl_mpsc_llfifo_push(&my_fifo_g,"second",6);
  cesl_mpsc_llfifo_push(&my_fifo_g,"third",5);
  local_58.data_._0_4_ = 3;
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       cesl_mpsc_llfifo_size(&my_fifo_g);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_40,"3","cesl_mpsc_llfifo_size(&my_fifo_g)",(int *)&local_58,
             (unsigned_long *)&local_50);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/cesl/cesl_concurrent/unittest/cesl_mpsc_llfifo_unittest.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_50._M_head_impl._0_4_ = 1;
  iVar1 = cesl_mpsc_llfifo_full(&my_fifo_g);
  local_58.data_._0_4_ = iVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_40,"1","cesl_mpsc_llfifo_full(&my_fifo_g)",(int *)&local_50,
             (int *)&local_58);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/cesl/cesl_concurrent/unittest/cesl_mpsc_llfifo_unittest.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_50._M_head_impl = local_50._M_head_impl & 0xffffffff00000000;
  iVar1 = cesl_mpsc_llfifo_empty(&my_fifo_g);
  local_58.data_._0_4_ = iVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_40,"0","cesl_mpsc_llfifo_empty(&my_fifo_g)",(int *)&local_50,
             (int *)&local_58);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/cesl/cesl_concurrent/unittest/cesl_mpsc_llfifo_unittest.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_40 = (undefined1  [8])&local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"first","");
  local_58.data_ = (AssertHelperData *)cesl_mpsc_llfifo_front(&my_fifo_g);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char*>
            ((internal *)&local_50,"std::string(\"first\")","cesl_mpsc_llfifo_front(&my_fifo_g)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (char **)&local_58);
  if (local_40 != (undefined1  [8])&local_30) {
    operator_delete((void *)local_40,local_30._M_allocated_capacity + 1);
  }
  if (local_50._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_40);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/cesl/cesl_concurrent/unittest/cesl_mpsc_llfifo_unittest.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_40 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_40 + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  local_1c = cesl_mpsc_llfifo_push(&my_fifo_g,"fourth",6);
  local_50._M_head_impl = local_50._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>((internal *)local_40,"0","ok",(int *)&local_50,&local_1c);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/cesl/cesl_concurrent/unittest/cesl_mpsc_llfifo_unittest.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_58.data_._0_4_ = 3;
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       cesl_mpsc_llfifo_size(&my_fifo_g);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_40,"3","cesl_mpsc_llfifo_size(&my_fifo_g)",(int *)&local_58,
             (unsigned_long *)&local_50);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/cesl/cesl_concurrent/unittest/cesl_mpsc_llfifo_unittest.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_50._M_head_impl._0_4_ = 1;
  iVar1 = cesl_mpsc_llfifo_full(&my_fifo_g);
  local_58.data_._0_4_ = iVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_40,"1","cesl_mpsc_llfifo_full(&my_fifo_g)",(int *)&local_50,
             (int *)&local_58);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/cesl/cesl_concurrent/unittest/cesl_mpsc_llfifo_unittest.cpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_50._M_head_impl = local_50._M_head_impl & 0xffffffff00000000;
  iVar1 = cesl_mpsc_llfifo_empty(&my_fifo_g);
  local_58.data_._0_4_ = iVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_40,"0","cesl_mpsc_llfifo_empty(&my_fifo_g)",(int *)&local_50,
             (int *)&local_58);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/cesl/cesl_concurrent/unittest/cesl_mpsc_llfifo_unittest.cpp"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_40 = (undefined1  [8])&local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"first","");
  local_58.data_ = (AssertHelperData *)cesl_mpsc_llfifo_front(&my_fifo_g);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char*>
            ((internal *)&local_50,"std::string(\"first\")","cesl_mpsc_llfifo_front(&my_fifo_g)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (char **)&local_58);
  if (local_40 != (undefined1  [8])&local_30) {
    operator_delete((void *)local_40,local_30._M_allocated_capacity + 1);
  }
  if (local_50._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_40);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/cesl/cesl_concurrent/unittest/cesl_mpsc_llfifo_unittest.cpp"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_40 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_40 + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  return;
}

Assistant:

TEST(cesl_mpsc_llfifo_unittest, push_beyond_full)
{
    cesl_mpsc_llfifo_create(&my_fifo_g, my_fifo_elem_max_size, my_fifo_elems_max_count, (char*)my_fifo_buffer_g);
    test_cesl_mpsc_llfifo_push("first");
    test_cesl_mpsc_llfifo_push("second");
    test_cesl_mpsc_llfifo_push("third");
    EXPECT_EQ(3, cesl_mpsc_llfifo_size(&my_fifo_g));
    EXPECT_EQ(1, cesl_mpsc_llfifo_full(&my_fifo_g));
    EXPECT_EQ(0, cesl_mpsc_llfifo_empty(&my_fifo_g));
    EXPECT_EQ(std::string("first"), cesl_mpsc_llfifo_front(&my_fifo_g));

    // Beyond
    auto ok = test_cesl_mpsc_llfifo_push("fourth");
    EXPECT_EQ(0, ok);
    EXPECT_EQ(3, cesl_mpsc_llfifo_size(&my_fifo_g));
    EXPECT_EQ(1, cesl_mpsc_llfifo_full(&my_fifo_g));
    EXPECT_EQ(0, cesl_mpsc_llfifo_empty(&my_fifo_g));
    EXPECT_EQ(std::string("first"), cesl_mpsc_llfifo_front(&my_fifo_g));
}